

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O1

dictionary * iniparser_load(char *ininame)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  dictionary *d;
  char *pcVar6;
  size_t sVar7;
  ushort **ppuVar8;
  char *val_00;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char line [1025];
  char val [1025];
  char section [1025];
  char key [1025];
  char tmp [2049];
  undefined8 local_1880;
  char local_1878 [1040];
  undefined4 local_1468;
  char local_1058 [1040];
  char local_c48 [1040];
  char local_838 [2056];
  
  __stream = fopen(ininame,"r");
  if (__stream == (FILE *)0x0) {
    d = (dictionary *)0x0;
    fprintf(_stderr,"iniparser: cannot open %s\n",ininame);
  }
  else {
    d = dictionary_new(0);
    if (d == (dictionary *)0x0) {
LAB_0010d7ff:
      fclose(__stream);
      d = (dictionary *)0x0;
    }
    else {
      local_1880 = ininame;
      memset(local_1878,0,0x400);
      memset(local_1058,0,0x400);
      memset(local_c48,0,0x400);
      memset(&local_1468,0,0x400);
      uVar12 = 0;
      iVar9 = 0;
      do {
        uVar14 = 0;
        do {
          do {
            pcVar6 = fgets(local_1878 + uVar14,0x400 - (int)uVar14,__stream);
            if (pcVar6 == (char *)0x0) {
              if (iVar9 == 0) goto LAB_0010d7ad;
              goto LAB_0010d79a;
            }
            uVar12 = uVar12 + 1;
            sVar7 = strlen(local_1878);
            uVar4 = (uint)sVar7;
            uVar13 = (long)(int)uVar4 - 1;
          } while ((int)uVar13 == 0);
          if ((local_1878[(long)(int)uVar4 + -1] != '\n') && (iVar3 = feof(__stream), iVar3 == 0)) {
            fprintf(_stderr,"iniparser: input line too long in %s (%d)\n",local_1880,(ulong)uVar12);
            dictionary_del(d);
            goto LAB_0010d7ff;
          }
          if (0 < (int)uVar4) {
            lVar10 = (uVar13 & 0xffffffff) + 1;
            do {
              uVar4 = uVar4 - 1;
              uVar13 = (ulong)uVar4;
              cVar1 = local_1878[lVar10 + -1];
              if (((long)cVar1 != 10) &&
                 (ppuVar8 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar8 + (long)cVar1 * 2 + 1) & 0x20) == 0)) goto LAB_0010d4e0;
              local_1878[lVar10 + -1] = '\0';
              lVar11 = lVar10 + -1;
              bVar2 = 0 < lVar10;
              lVar10 = lVar11;
            } while (lVar11 != 0 && bVar2);
            uVar13 = 0xffffffff;
          }
LAB_0010d4e0:
          uVar14 = uVar13 & 0xffffffff;
          if ((int)uVar13 < 1) {
            uVar14 = 0;
          }
        } while (local_1878[uVar14] == '\\');
        sVar7 = strlen(local_1878);
        pcVar6 = (char *)malloc(sVar7);
        strcpy(pcVar6,local_1878);
        uVar4 = strstrip(pcVar6);
        if (uVar4 == 0) {
          iVar3 = 2;
        }
        else {
          cVar1 = *pcVar6;
          iVar3 = 3;
          if ((cVar1 != '#') && (cVar1 != ';')) {
            if ((cVar1 == '[') && (pcVar6[(ulong)uVar4 - 1] == ']')) {
              __isoc99_sscanf(pcVar6,"[%[^]]",local_1058);
              strstrip(local_1058);
              strlwc(local_1058,local_1058,uVar4);
              iVar3 = 4;
            }
            else {
              iVar3 = __isoc99_sscanf(pcVar6,"%[^=] = \"%[^\"]\"",local_c48,&local_1468);
              if (((iVar3 == 2) ||
                  (iVar3 = __isoc99_sscanf(pcVar6,"%[^=] = \'%[^\']\'",local_c48,&local_1468),
                  iVar3 == 2)) ||
                 (iVar3 = __isoc99_sscanf(pcVar6,"%[^=] = %[^;#]",local_c48,&local_1468), iVar3 == 2
                 )) {
                strstrip(local_c48);
                strlwc(local_c48,local_c48,uVar4);
                strstrip((char *)&local_1468);
                if ((local_1468._2_1_ != '\0' || (short)local_1468 != 0x2222) &&
                   (iVar3 = 5, local_1468._2_1_ != '\0' || (short)local_1468 != 0x2727))
                goto LAB_0010d6d4;
              }
              else {
                iVar3 = __isoc99_sscanf(pcVar6,"%[^=] = %[;#]",local_c48,&local_1468);
                if (iVar3 != 2) {
                  iVar5 = __isoc99_sscanf(pcVar6,"%[^=] %[=]",local_c48,&local_1468);
                  iVar3 = 1;
                  if (iVar5 != 2) goto LAB_0010d6d4;
                }
                strstrip(local_c48);
                strlwc(local_c48,local_c48,uVar4);
              }
              local_1468 = local_1468 & 0xffffff00;
              iVar3 = 5;
            }
          }
        }
LAB_0010d6d4:
        val_00 = (char *)&local_1468;
        free(pcVar6);
        if (iVar3 == 4) {
          pcVar6 = local_1058;
          val_00 = (char *)0x0;
LAB_0010d731:
          iVar9 = dictionary_set(d,pcVar6,val_00);
        }
        else {
          if (iVar3 == 5) {
            pcVar6 = local_838;
            sprintf(pcVar6,"%s:%s",local_1058,local_c48);
            goto LAB_0010d731;
          }
          if (iVar3 == 1) {
            fprintf(_stderr,"iniparser: syntax error in %s (%d):\n",local_1880,(ulong)uVar12);
            fprintf(_stderr,"-> %s\n",local_1878);
            iVar9 = iVar9 + 1;
          }
        }
        memset(local_1878,0,0x400);
      } while (-1 < iVar9);
      iniparser_load_cold_1();
LAB_0010d79a:
      dictionary_del(d);
      d = (dictionary *)0x0;
LAB_0010d7ad:
      fclose(__stream);
    }
  }
  return d;
}

Assistant:

dictionary * iniparser_load(const char * ininame)
{
    FILE * in ;

    char line    [ASCIILINESZ+1] ;
    char section [ASCIILINESZ+1] ;
    char key     [ASCIILINESZ+1] ;
    char tmp     [(ASCIILINESZ * 2) + 1] ;
    char val     [ASCIILINESZ+1] ;

    int  last=0 ;
    int  len ;
    int  lineno=0 ;
    int  errs=0;

    dictionary * dict ;

    if ((in=fopen(ininame, "r"))==NULL) {
        fprintf(stderr, "iniparser: cannot open %s\n", ininame);
        return NULL ;
    }

    dict = dictionary_new(0) ;
    if (!dict) {
        fclose(in);
        return NULL ;
    }

    memset(line,    0, ASCIILINESZ);
    memset(section, 0, ASCIILINESZ);
    memset(key,     0, ASCIILINESZ);
    memset(val,     0, ASCIILINESZ);
    last=0 ;

    while (fgets(line+last, ASCIILINESZ-last, in)!=NULL) {
        lineno++ ;
        len = (int)strlen(line)-1;
        if (len==0)
            continue;
        /* Safety check against buffer overflows */
        if (line[len]!='\n' && !feof(in)) {
            fprintf(stderr,
                    "iniparser: input line too long in %s (%d)\n",
                    ininame,
                    lineno);
            dictionary_del(dict);
            fclose(in);
            return NULL ;
        }
        /* Get rid of \n and spaces at end of line */
        while ((len>=0) &&
                ((line[len]=='\n') || (isspace(line[len])))) {
            line[len]=0 ;
            len-- ;
        }
        if (len < 0) { /* Line was entirely \n and/or spaces */
            len = 0;
        }
        /* Detect multi-line */
        if (line[len]=='\\') {
            /* Multi-line value */
            last=len ;
            continue ;
        } else {
            last=0 ;
        }
        switch (iniparser_line(line, section, key, val)) {
            case LINE_EMPTY:
            case LINE_COMMENT:
            break ;

            case LINE_SECTION:
            errs = dictionary_set(dict, section, NULL);
            break ;

            case LINE_VALUE:
            sprintf(tmp, "%s:%s", section, key);
            errs = dictionary_set(dict, tmp, val) ;
            break ;

            case LINE_ERROR:
            fprintf(stderr, "iniparser: syntax error in %s (%d):\n",
                    ininame,
                    lineno);
            fprintf(stderr, "-> %s\n", line);
            errs++ ;
            break;

            default:
            break ;
        }
        memset(line, 0, ASCIILINESZ);
        last=0;
        if (errs<0) {
            fprintf(stderr, "iniparser: memory allocation failure\n");
            break ;
        }
    }
    if (errs) {
        dictionary_del(dict);
        dict = NULL ;
    }
    fclose(in);
    return dict ;
}